

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O1

void __thiscall
Assimp::IRRImporter::ComputeAnimations
          (IRRImporter *this,Node *root,aiNode *real,
          vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *anims)

{
  char *__s;
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  iterator __position;
  aiNode *paVar7;
  ai_uint32 aVar8;
  Logger *pLVar9;
  aiNode *paVar10;
  aiNode *this_00;
  aiNode **ppaVar11;
  aiVectorKey *paVar12;
  aiQuatKey *paVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  aiQuatKey *paVar25;
  iterator it;
  _List_node_base *p_Var26;
  _List_node_base *p_Var27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  char *pcVar32;
  long lVar33;
  long lVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  double dVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  aiNodeAnim *anim;
  float local_b8;
  aiNode *local_b0;
  float local_a4;
  float local_a0;
  float local_9c;
  double local_98;
  float local_8c;
  float local_88;
  float local_84;
  double local_80;
  uint local_74;
  IRRImporter *local_70;
  ulong local_68;
  Node *local_60;
  float local_54;
  _List_node_base *local_50;
  vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *local_48;
  aiNode *local_40;
  double local_38;
  
  local_70 = this;
  if ((root == (Node *)0x0) || (real == (aiNode *)0x0)) {
    __assert_fail("nullptr != root && nullptr != real",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Irr/IRRLoader.cpp"
                  ,0x137,
                  "void Assimp::IRRImporter::ComputeAnimations(Node *, aiNode *, std::vector<aiNodeAnim *> &)"
                 );
  }
  p_Var27 = (_List_node_base *)&root->animators;
  p_Var26 = (root->animators).
            super__List_base<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var26 != p_Var27) {
    uVar17 = 0;
    local_40 = real;
    do {
      if ((*(int *)&p_Var26[1]._M_next == 5) || (*(int *)&p_Var26[1]._M_next == 0)) {
        pLVar9 = DefaultLogger::get();
        Logger::warn(pLVar9,"IRR: Skipping unknown or unsupported animator");
      }
      else {
        uVar17 = (ulong)((int)uVar17 + 1);
      }
      p_Var26 = p_Var26->_M_next;
    } while (p_Var26 != p_Var27);
    if ((int)uVar17 != 0) {
      local_68 = uVar17;
      if ((int)uVar17 == 1) {
        pLVar9 = DefaultLogger::get();
        Logger::warn(pLVar9,"IRR: Adding dummy nodes to simulate multiple animators");
      }
      p_Var26 = (((list<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>
                   *)p_Var27)->
                super__List_base<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var26 != p_Var27) {
        local_74 = 0;
        local_60 = root;
        local_50 = p_Var27;
        local_48 = (vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)anims;
        do {
          if ((*(int *)&p_Var26[1]._M_next != 0) && (*(int *)&p_Var26[1]._M_next != 5)) {
            paVar10 = (aiNode *)operator_new(0x438);
            (paVar10->mName).length = 0;
            __s = (paVar10->mName).data;
            (paVar10->mName).data[0] = '\0';
            memset((paVar10->mName).data + 1,0x1b,0x3ff);
            *(aiQuatKey **)&(paVar10->mTransformation).b2 = (aiQuatKey *)0x0;
            (paVar10->mTransformation).b4 = 0.0;
            (paVar10->mTransformation).a1 = 0.0;
            (paVar10->mTransformation).a2 = 0.0;
            (paVar10->mTransformation).a3 = 0.0;
            (paVar10->mTransformation).a4 = 0.0;
            *(aiVectorKey **)&(paVar10->mTransformation).c2 = (aiVectorKey *)0x0;
            (paVar10->mTransformation).c4 = 0.0;
            (paVar10->mTransformation).d1 = 0.0;
            uVar14 = (int)local_68 - 1;
            local_b0 = paVar10;
            if (local_74 == uVar14) {
              uVar17 = (root->name)._M_string_length;
              if (uVar17 < 0x400) {
                (paVar10->mName).length = (ai_uint32)uVar17;
                memcpy(__s,(local_60->name)._M_dataplus._M_p,uVar17);
                (paVar10->mName).data[uVar17] = '\0';
              }
            }
            else {
              pcVar32 = "";
              if ((root->name)._M_string_length != 0) {
                pcVar32 = (root->name)._M_dataplus._M_p;
              }
              aVar8 = snprintf(__s,0x400,"$INST_DUMMY_%i_%s",(ulong)uVar14,pcVar32);
              (local_b0->mName).length = aVar8;
              this_00 = (aiNode *)operator_new(0x478);
              aiNode::aiNode(this_00);
              paVar7 = local_40;
              paVar10 = local_40->mParent;
              if (paVar10->mNumChildren != 0) {
                uVar17 = 0;
                do {
                  if (paVar10->mChildren[uVar17] == local_40) {
                    paVar10->mChildren[uVar17] = this_00;
                  }
                  uVar17 = uVar17 + 1;
                  paVar10 = local_40->mParent;
                } while (uVar17 < paVar10->mNumChildren);
              }
              this_00->mParent = paVar10;
              if (this_00 != local_b0) {
                uVar14 = (local_b0->mName).length;
                (this_00->mName).length = uVar14;
                memcpy((this_00->mName).data,(local_b0->mName).data,(ulong)uVar14);
                (this_00->mName).data[uVar14] = '\0';
              }
              this_00->mNumChildren = 1;
              ppaVar11 = (aiNode **)operator_new__(8);
              this_00->mChildren = ppaVar11;
              *ppaVar11 = paVar7;
              paVar7->mParent = this_00;
            }
            paVar10 = local_b0;
            switch(*(undefined4 *)&p_Var26[1]._M_next) {
            case 1:
              uVar14 = (int)(*(float *)((long)&p_Var26[1]._M_prev + 4) * 100.0) % 0x168;
              uVar31 = (int)(*(float *)&p_Var26[2]._M_next * 100.0) % 0x168;
              uVar15 = (int)(*(float *)&p_Var26[1]._M_prev * 100.0) % 0x168;
              if ((uVar14 != 0 && uVar15 != 0) && (uVar31 * uVar14 != 0)) {
                uVar16 = 3;
                if ((2 < (int)uVar15) &&
                   (((uVar16 = 10, 9 < (int)uVar15 && (uVar16 = 0x14, 0x13 < (int)uVar15)) &&
                    (uVar16 = uVar15, (int)uVar15 < 0x1f)))) {
                  uVar16 = 0x1e;
                }
                uVar15 = uVar16;
                uVar16 = 3;
                if (((2 < (int)uVar14) && (uVar16 = 10, 9 < (int)uVar14)) &&
                   ((uVar16 = 0x14, 0x13 < (int)uVar14 && (uVar16 = uVar14, (int)uVar14 < 0x1f)))) {
                  uVar16 = 0x1e;
                }
                uVar14 = uVar16;
                if ((int)uVar31 < 3) {
                  uVar31 = 3;
                }
                else if ((int)uVar31 < 10) {
                  uVar31 = 10;
                }
                else if ((int)uVar31 < 0x14) {
                  uVar31 = 0x14;
                }
                else if ((int)uVar31 < 0x1f) {
                  uVar31 = 0x1e;
                }
              }
              if (uVar15 == 0) {
                uVar16 = 0x168;
              }
              else {
                iVar21 = 0x168;
                uVar17 = (ulong)uVar15;
                do {
                  uVar18 = (long)(int)uVar17 % (long)iVar21;
                  uVar17 = uVar18 & 0xffffffff;
                  iVar20 = (int)uVar18;
                  iVar22 = iVar21;
                  if (iVar20 == 0) break;
                  iVar21 = iVar21 % iVar20;
                  iVar22 = iVar20;
                } while (iVar21 != 0);
                uVar16 = (int)(0x168 / (long)iVar22) * uVar15;
              }
              if (uVar14 != 0) {
                uVar28 = uVar14;
                if (uVar16 != 0) {
                  uVar17 = (ulong)uVar14;
                  uVar18 = (ulong)uVar16;
                  do {
                    uVar29 = (uint)uVar18;
                    uVar17 = (long)(int)uVar17 % (long)(int)uVar29;
                    uVar23 = (uint)uVar17;
                    uVar28 = uVar29;
                    if (uVar23 == 0) break;
                    uVar17 = uVar17 & 0xffffffff;
                    uVar18 = (long)(int)uVar29 % (long)(int)uVar23 & 0xffffffff;
                    uVar28 = uVar23;
                  } while ((int)((long)(int)uVar29 % (long)(int)uVar23) != 0);
                }
                uVar16 = ((int)uVar16 / (int)uVar28) * uVar14;
              }
              if (uVar31 != 0) {
                uVar28 = uVar31;
                if (uVar16 != 0) {
                  uVar17 = (ulong)uVar31;
                  uVar18 = (ulong)uVar16;
                  do {
                    uVar29 = (uint)uVar18;
                    uVar17 = (long)(int)uVar17 % (long)(int)uVar29;
                    uVar23 = (uint)uVar17;
                    uVar28 = uVar29;
                    if (uVar23 == 0) break;
                    uVar17 = uVar17 & 0xffffffff;
                    uVar18 = (long)(int)uVar29 % (long)(int)uVar23 & 0xffffffff;
                    uVar28 = uVar23;
                  } while ((int)((long)(int)uVar29 % (long)(int)uVar23) != 0);
                }
                uVar16 = ((int)uVar16 / (int)uVar28) * uVar31;
              }
              if (uVar16 != 0x168) {
                fVar40 = (float)(int)uVar16;
                fVar36 = 0.0;
                if (uVar15 != 0) {
                  fVar36 = fVar40 / (float)(int)uVar15;
                }
                fVar35 = fVar36;
                if ((uVar14 != 0) &&
                   (fVar35 = fVar40 / (float)(int)uVar14, fVar40 / (float)(int)uVar14 <= fVar36)) {
                  fVar35 = fVar36;
                }
                fVar36 = fVar35;
                if ((uVar31 != 0) &&
                   (fVar36 = fVar40 / (float)(int)uVar31, fVar40 / (float)(int)uVar31 <= fVar35)) {
                  fVar36 = fVar35;
                }
                uVar17 = (ulong)((double)fVar36 * local_70->fps);
                fVar36 = (float)uVar17;
                (local_b0->mTransformation).a4 = fVar36;
                uVar17 = uVar17 & 0xffffffff;
                paVar13 = (aiQuatKey *)operator_new__(uVar17 * 0x18);
                if (fVar36 != 0.0) {
                  paVar25 = paVar13;
                  do {
                    paVar25->mTime = 0.0;
                    (paVar25->mValue).w = 1.0;
                    (paVar25->mValue).x = 0.0;
                    (paVar25->mValue).y = 0.0;
                    (paVar25->mValue).z = 0.0;
                    paVar25 = paVar25 + 1;
                  } while (paVar25 != paVar13 + uVar17);
                }
                *(aiQuatKey **)&(paVar10->mTransformation).b2 = paVar13;
                if ((local_b0->mTransformation).a4 != 0.0) {
                  local_98 = (double)((ulong)local_98 & 0xffffffff00000000);
                  lVar34 = 0x14;
                  uVar17 = 0;
                  local_b8 = 0.0;
                  fVar36 = 0.0;
                  do {
                    paVar13 = *(aiQuatKey **)&(local_b0->mTransformation).b2;
                    local_9c = fVar36;
                    fVar40 = sinf(fVar36 * 0.5);
                    local_80 = (double)CONCAT44(local_80._4_4_,fVar40);
                    fVar36 = cosf(fVar36 * 0.5);
                    local_a4 = local_b8 * 0.5;
                    local_a0 = sinf(local_a4);
                    local_a4 = cosf(local_a4);
                    local_8c = local_98._0_4_ * 0.5;
                    local_88 = sinf(local_8c);
                    fVar40 = cosf(local_8c);
                    *(float *)((long)paVar13 + lVar34 + -0xc) =
                         fVar36 * local_a4 * fVar40 + local_80._0_4_ * local_a0 * local_88;
                    *(float *)((long)paVar13 + lVar34 + -8) =
                         local_88 * fVar36 * local_a4 - local_80._0_4_ * local_a0 * fVar40;
                    *(float *)((long)paVar13 + lVar34 + -4) =
                         local_80._0_4_ * fVar40 * local_a4 + fVar36 * local_88 * local_a0;
                    *(float *)((long)&paVar13->mTime + lVar34) =
                         fVar36 * fVar40 * local_a0 - local_80._0_4_ * local_88 * local_a4;
                    *(double *)((long)paVar13 + lVar34 + -0x14) = (double)(uVar17 & 0xffffffff);
                    fVar36 = local_9c + *(float *)&p_Var26[1]._M_prev;
                    local_b8 = local_b8 + *(float *)((long)&p_Var26[1]._M_prev + 4);
                    local_98 = (double)CONCAT44(local_98._4_4_,
                                                local_98._0_4_ + *(float *)&p_Var26[2]._M_next);
                    uVar17 = uVar17 + 1;
                    lVar34 = lVar34 + 0x18;
                  } while (uVar17 < (uint)(local_b0->mTransformation).a4);
                }
                goto LAB_003e6a16;
              }
              break;
            case 2:
              local_98 = local_70->fps;
              uVar17 = (ulong)(((1.0 / (double)*(float *)((long)&p_Var26[1]._M_next + 4)) / 1000.0)
                              * local_98);
              fVar36 = (float)uVar17;
              (local_b0->mTransformation).a1 = fVar36;
              uVar17 = (uVar17 & 0xffffffff) * 0x18;
              paVar12 = (aiVectorKey *)operator_new__(uVar17);
              if (fVar36 != 0.0) {
                uVar18 = 0;
                do {
                  puVar1 = (undefined8 *)((long)&paVar12->mTime + uVar18);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined4 *)((long)&(paVar12->mValue).z + uVar18) = 0;
                  uVar18 = uVar18 + 0x18;
                } while (uVar17 != uVar18);
              }
              *(aiVectorKey **)&(paVar10->mTransformation).a2 = paVar12;
              fVar36 = *(float *)((long)&p_Var26[1]._M_prev + 4);
              fVar40 = *(float *)&p_Var26[1]._M_prev;
              fVar35 = *(float *)&p_Var26[2]._M_next;
              if ((fVar36 != 0.0) || (NAN(fVar36))) {
                local_a4 = fVar35 * 0.0;
                local_88 = fVar40 * 0.0 + fVar35 * -50.0;
                fVar40 = fVar40 * -0.0;
                local_a0 = fVar36 * 50.0;
              }
              else {
                local_a4 = fVar35 * 50.0;
                local_88 = fVar40 * 0.0 + fVar35 * -0.0;
                fVar40 = fVar40 * -50.0;
                local_a0 = fVar36 * 0.0;
              }
              local_a4 = local_a4 + fVar36 * -0.0;
              local_a0 = local_a0 + fVar40;
              fVar36 = local_a0 * local_a0 + local_a4 * local_a4 + local_88 * local_88;
              if (fVar36 < 0.0) {
                fVar36 = sqrtf(fVar36);
              }
              else {
                fVar36 = SQRT(fVar36);
              }
              fVar36 = 1.0 / fVar36;
              local_a4 = local_a4 * fVar36;
              local_88 = local_88 * fVar36;
              local_a0 = local_a0 * fVar36;
              fVar36 = *(float *)((long)&p_Var26[1]._M_prev + 4);
              fVar40 = local_88 * *(float *)&p_Var26[2]._M_next - fVar36 * local_a0;
              fVar35 = local_a0 * *(float *)&p_Var26[1]._M_prev -
                       *(float *)&p_Var26[2]._M_next * local_a4;
              fVar42 = fVar36 * local_a4 - *(float *)&p_Var26[1]._M_prev * local_88;
              fVar36 = fVar42 * fVar42 + fVar40 * fVar40 + fVar35 * fVar35;
              if (fVar36 < 0.0) {
                local_8c = fVar40;
                local_84 = fVar35;
                fVar36 = sqrtf(fVar36);
                fVar40 = local_8c;
                fVar35 = local_84;
              }
              else {
                fVar36 = SQRT(fVar36);
              }
              if ((local_b0->mTransformation).a1 != 0.0) {
                local_38 = 1000.0 / local_98;
                fVar36 = 1.0 / fVar36;
                local_8c = fVar40 * fVar36;
                local_84 = fVar35 * fVar36;
                local_54 = fVar36 * fVar42;
                lVar34 = 0x10;
                uVar17 = 0;
                do {
                  paVar12 = *(aiVectorKey **)&(local_b0->mTransformation).a2;
                  dVar41 = (double)(uVar17 & 0xffffffff) * local_38;
                  *(double *)((long)paVar12 + lVar34 + -0x10) = dVar41;
                  fVar36 = (float)((double)*(float *)((long)&p_Var26[1]._M_next + 4) * dVar41);
                  local_98 = (double)CONCAT44(local_98._4_4_,*(undefined4 *)&p_Var26[3]._M_next);
                  fVar40 = cosf(fVar36);
                  local_80 = (double)CONCAT44(local_80._4_4_,local_8c * fVar40);
                  local_9c = local_84 * fVar40;
                  fVar40 = fVar40 * local_54;
                  fVar35 = sinf(fVar36);
                  fVar36 = *(float *)((long)&p_Var26[2]._M_prev + 4);
                  *(ulong *)((long)paVar12 + lVar34 + -8) =
                       CONCAT44((local_88 * fVar35 + local_9c) * local_98._0_4_ +
                                *(float *)&p_Var26[2]._M_prev,
                                (local_a4 * fVar35 + local_80._0_4_) * local_98._0_4_ +
                                *(float *)((long)&p_Var26[2]._M_next + 4));
                  *(float *)((long)&paVar12->mTime + lVar34) =
                       (fVar35 * local_a0 + fVar40) * local_98._0_4_ + fVar36;
                  uVar17 = uVar17 + 1;
                  lVar34 = lVar34 + 0x18;
                } while (uVar17 < (uint)(local_b0->mTransformation).a1);
              }
LAB_003e6a16:
              (local_b0->mTransformation).c4 = 4.2039e-45;
              (local_b0->mTransformation).d1 = 4.2039e-45;
              break;
            case 3:
              fVar36 = (float)((uint)*(byte *)&p_Var26[5]._M_next * 2 + aiAnimBehaviour_CONSTANT);
              (local_b0->mTransformation).c4 = fVar36;
              (local_b0->mTransformation).d1 = fVar36;
              local_80 = local_70->fps;
              uVar17 = (ulong)(((double)*(int *)((long)&p_Var26[5]._M_next + 4) / 1000.0) * local_80
                              );
              fVar36 = (float)uVar17;
              (local_b0->mTransformation).a1 = fVar36;
              uVar17 = (uVar17 & 0xffffffff) * 0x18;
              paVar12 = (aiVectorKey *)operator_new__(uVar17);
              if (fVar36 != 0.0) {
                uVar18 = 0;
                do {
                  puVar1 = (undefined8 *)((long)&paVar12->mTime + uVar18);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined4 *)((long)&(paVar12->mValue).z + uVar18) = 0;
                  uVar18 = uVar18 + 0x18;
                } while (uVar17 != uVar18);
              }
              *(aiVectorKey **)&(paVar10->mTransformation).a2 = paVar12;
              fVar40 = *(float *)&p_Var26[1]._M_prev - *(float *)((long)&p_Var26[2]._M_next + 4);
              fVar44 = *(float *)((long)&p_Var26[1]._M_prev + 4) - *(float *)&p_Var26[2]._M_prev;
              local_9c = *(float *)&p_Var26[2]._M_next - *(float *)((long)&p_Var26[2]._M_prev + 4);
              fVar35 = local_9c * local_9c + fVar40 * fVar40 + fVar44 * fVar44;
              fVar42 = SQRT(fVar35);
              local_98 = (double)CONCAT44(local_98._4_4_,fVar40);
              fVar36 = fVar42;
              if (fVar35 < 0.0) {
                local_a0 = fVar42;
                fVar36 = sqrtf(fVar35);
                fVar42 = sqrtf(fVar35);
                fVar40 = local_98._0_4_;
              }
              if ((local_b0->mTransformation).a1 != 0.0) {
                fVar42 = 1.0 / fVar42;
                iVar21 = *(int *)((long)&p_Var26[5]._M_next + 4);
                lVar34 = 0x10;
                uVar17 = 0;
                do {
                  paVar12 = *(aiVectorKey **)&(local_b0->mTransformation).a2;
                  dVar41 = (double)(uVar17 & 0xffffffff) * (1000.0 / local_80);
                  *(double *)((long)paVar12 + lVar34 + -0x10) = dVar41;
                  fVar39 = (float)(dVar41 * (double)(fVar36 / (float)iVar21));
                  fVar35 = *(float *)((long)&p_Var26[2]._M_prev + 4);
                  *(ulong *)((long)paVar12 + lVar34 + -8) =
                       CONCAT44(fVar44 * fVar42 * fVar39 + *(float *)&p_Var26[2]._M_prev,
                                fVar40 * fVar42 * fVar39 + *(float *)((long)&p_Var26[2]._M_next + 4)
                               );
                  *(float *)((long)&paVar12->mTime + lVar34) = fVar39 * local_9c * fVar42 + fVar35;
                  uVar17 = uVar17 + 1;
                  lVar34 = lVar34 + 0x18;
                } while (uVar17 < (uint)(local_b0->mTransformation).a1);
              }
              break;
            case 4:
              (local_b0->mTransformation).c4 = 4.2039e-45;
              (local_b0->mTransformation).d1 = 4.2039e-45;
              iVar21 = (int)((ulong)((long)p_Var26[4]._M_next - (long)p_Var26[3]._M_prev) >> 3);
              uVar14 = iVar21 * -0x55555555;
              if (uVar14 == 1) {
                (local_b0->mTransformation).a1 = 1.4013e-45;
                paVar12 = (aiVectorKey *)operator_new__(0x18);
                paVar12->mTime = 0.0;
                (paVar12->mValue).x = 0.0;
                (paVar12->mValue).y = 0.0;
                (paVar12->mValue).z = 0.0;
                *(aiVectorKey **)&(paVar10->mTransformation).a2 = paVar12;
                p_Var27 = p_Var26[3]._M_prev;
                *(_List_node_base **)&paVar12->mValue = p_Var27->_M_prev;
                (paVar12->mValue).z = *(float *)&p_Var27[1]._M_next;
                (*(aiVectorKey **)&(paVar10->mTransformation).a2)->mTime = 0.0;
              }
              else if (uVar14 == 0) {
                pLVar9 = DefaultLogger::get();
                Logger::warn(pLVar9,"IRR: Spline animators with no points defined");
                paVar10 = local_b0;
                if (local_b0 != (aiNode *)0x0) {
                  aiNodeAnim::~aiNodeAnim((aiNodeAnim *)local_b0);
                  operator_delete(paVar10,0x438);
                }
                local_b0 = (aiNode *)0x0;
              }
              else {
                uVar17 = (ulong)(local_70->fps * 15.0);
                fVar36 = (float)uVar17;
                (local_b0->mTransformation).a1 = fVar36;
                uVar17 = (uVar17 & 0xffffffff) * 0x18;
                paVar12 = (aiVectorKey *)operator_new__(uVar17);
                if (fVar36 != 0.0) {
                  uVar18 = 0;
                  do {
                    puVar1 = (undefined8 *)((long)&paVar12->mTime + uVar18);
                    *puVar1 = 0;
                    puVar1[1] = 0;
                    *(undefined4 *)((long)&(paVar12->mValue).z + uVar18) = 0;
                    uVar18 = uVar18 + 0x18;
                  } while (uVar17 != uVar18);
                }
                *(aiVectorKey **)&(paVar10->mTransformation).a2 = paVar12;
                if ((local_b0->mTransformation).a1 != 0.0) {
                  uVar15 = -((int)uVar14 >> 0x1f & uVar14);
                  lVar34 = 0x10;
                  uVar17 = 0;
                  do {
                    paVar12 = *(aiVectorKey **)&(local_b0->mTransformation).a2;
                    fVar36 = (float)(uVar17 & 0xffffffff) *
                             *(float *)((long)&p_Var26[1]._M_next + 4) * 0.001;
                    local_98 = (double)CONCAT44(local_98._4_4_,fVar36);
                    fVar36 = floorf(fVar36);
                    iVar22 = (int)fVar36 % (int)uVar14;
                    uVar31 = uVar15;
                    if (iVar22 < 1) {
                      uVar31 = uVar14;
                    }
                    p_Var27 = p_Var26[3]._M_prev;
                    uVar16 = uVar15;
                    if (iVar22 < 0) {
                      uVar16 = uVar14;
                    }
                    lVar19 = (long)(int)(iVar22 + -1 + uVar31);
                    lVar30 = (long)(int)(uVar16 + iVar22);
                    uVar31 = uVar14;
                    if (SBORROW4(iVar22 + 1,uVar14) != iVar22 + 1 + iVar21 * 0x55555555 < 0) {
                      uVar31 = 0;
                    }
                    uVar31 = -uVar31;
                    if (iVar22 < -1) {
                      uVar31 = uVar14;
                    }
                    uVar16 = uVar14;
                    if (SBORROW4(iVar22 + 2,uVar14) != iVar22 + 2 + iVar21 * 0x55555555 < 0) {
                      uVar16 = 0;
                    }
                    lVar33 = (long)(int)(uVar31 + 1 + iVar22);
                    fVar40 = (local_98._0_4_ - fVar36) * (local_98._0_4_ - fVar36);
                    fVar36 = fVar40 + fVar40;
                    uVar31 = -uVar16;
                    if (iVar22 < -2) {
                      uVar31 = uVar14;
                    }
                    fVar38 = fVar36 * 3.0 + fVar36 * -2.0;
                    fVar43 = fVar36 * -2.0 + fVar36;
                    fVar37 = fVar36 - fVar40;
                    fVar35 = *(float *)((long)p_Var27 + lVar33 * 0x18 + 8);
                    fVar42 = *(float *)((long)p_Var27 + lVar33 * 0x18 + 0xc);
                    lVar24 = (long)(int)(uVar31 + 2 + iVar22);
                    fVar44 = *(float *)((long)p_Var27 + lVar33 * 0x18 + 0x10);
                    fVar39 = *(float *)((long)p_Var27 + lVar19 * 0x18 + 0x10);
                    fVar2 = *(float *)((long)&p_Var26[3]._M_next + 4);
                    fVar3 = *(float *)((long)p_Var27 + lVar30 * 0x18 + 8);
                    fVar4 = *(float *)((long)p_Var27 + lVar30 * 0x18 + 0xc);
                    fVar5 = *(float *)((long)p_Var27 + lVar24 * 0x18 + 0x10);
                    fVar6 = *(float *)((long)p_Var27 + lVar30 * 0x18 + 0x10);
                    fVar36 = fVar36 + fVar36 + fVar40 * -3.0 + 1.0;
                    *(ulong *)((long)paVar12 + lVar34 + -8) =
                         CONCAT44((*(float *)((long)p_Var27 + lVar24 * 0x18 + 0xc) - fVar4) * fVar2
                                  * fVar37 +
                                  (fVar42 - *(float *)((long)p_Var27 + lVar19 * 0x18 + 0xc)) * fVar2
                                  * fVar43 + fVar42 * fVar38 + fVar4 * fVar36,
                                  (*(float *)((long)p_Var27 + lVar24 * 0x18 + 8) - fVar3) * fVar2 *
                                  fVar37 + (fVar35 - *(float *)((long)p_Var27 + lVar19 * 0x18 + 8))
                                           * fVar2 * fVar43 + fVar35 * fVar38 + fVar3 * fVar36);
                    *(float *)((long)&paVar12->mTime + lVar34) =
                         (fVar5 - fVar6) * fVar2 * fVar37 +
                         (fVar44 - fVar39) * fVar2 * fVar43 + fVar38 * fVar44 + fVar36 * fVar6;
                    *(double *)((long)paVar12 + lVar34 + -0x10) = (double)(uVar17 & 0xffffffff);
                    uVar17 = uVar17 + 1;
                    lVar34 = lVar34 + 0x18;
                  } while (uVar17 < (uint)(local_b0->mTransformation).a1);
                }
              }
            }
            p_Var27 = local_50;
            root = local_60;
            if (local_b0 != (aiNode *)0x0) {
              __position._M_current = *(aiNodeAnim ***)(local_48 + 8);
              if (__position._M_current == *(aiNodeAnim ***)(local_48 + 0x10)) {
                std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
                _M_realloc_insert<aiNodeAnim*const&>(local_48,__position,(aiNodeAnim **)&local_b0);
              }
              else {
                *__position._M_current = (aiNodeAnim *)local_b0;
                *(long *)(local_48 + 8) = *(long *)(local_48 + 8) + 8;
              }
              local_68 = (ulong)((int)local_68 + 1);
            }
            local_74 = local_74 + 1;
          }
          p_Var26 = p_Var26->_M_next;
        } while (p_Var26 != p_Var27);
      }
    }
  }
  return;
}

Assistant:

void IRRImporter::ComputeAnimations(Node* root, aiNode* real, std::vector<aiNodeAnim*>& anims)
{
    ai_assert(nullptr != root && nullptr != real);

    // XXX totally WIP - doesn't produce proper results, need to evaluate
    // whether there's any use for Irrlicht's proprietary scene format
    // outside Irrlicht ...
    // This also applies to the above function of FindSuitableMultiple and ClampSpline which are
    // solely used in this function

    if (root->animators.empty()) {
        return;
    }
    unsigned int total( 0 );
    for (std::list<Animator>::iterator it = root->animators.begin();it != root->animators.end(); ++it)  {
        if ((*it).type == Animator::UNKNOWN || (*it).type == Animator::OTHER)   {
            ASSIMP_LOG_WARN("IRR: Skipping unknown or unsupported animator");
            continue;
        }
        ++total;
    }
    if (!total) {
        return;
    } else if (1 == total)    {
        ASSIMP_LOG_WARN("IRR: Adding dummy nodes to simulate multiple animators");
    }

    // NOTE: 1 tick == i millisecond

    unsigned int cur = 0;
    for (std::list<Animator>::iterator it = root->animators.begin();
        it != root->animators.end(); ++it)
    {
        if ((*it).type == Animator::UNKNOWN || (*it).type == Animator::OTHER)continue;

        Animator& in = *it ;
        aiNodeAnim* anim = new aiNodeAnim();

        if (cur != total-1) {
            // Build a new name - a prefix instead of a suffix because it is
            // easier to check against
            anim->mNodeName.length = ::ai_snprintf(anim->mNodeName.data, MAXLEN,
                "$INST_DUMMY_%i_%s",total-1,
                (root->name.length() ? root->name.c_str() : ""));

            // we'll also need to insert a dummy in the node hierarchy.
            aiNode* dummy = new aiNode();

            for (unsigned int i = 0; i < real->mParent->mNumChildren;++i)
                if (real->mParent->mChildren[i] == real)
                    real->mParent->mChildren[i] = dummy;

            dummy->mParent = real->mParent;
            dummy->mName = anim->mNodeName;

            dummy->mNumChildren = 1;
            dummy->mChildren = new aiNode*[dummy->mNumChildren];
            dummy->mChildren[0] = real;

            // the transformation matrix of the dummy node is the identity

            real->mParent = dummy;
        }
        else anim->mNodeName.Set(root->name);
        ++cur;

        switch (in.type)    {
        case Animator::ROTATION:
            {
                // -----------------------------------------------------
                // find out how long a full rotation will take
                // This is the least common multiple of 360.f and all
                // three euler angles. Although we'll surely find a
                // possible multiple (haha) it could be somewhat large
                // for our purposes. So we need to modify the angles
                // here in order to get good results.
                // -----------------------------------------------------
                int angles[3];
                angles[0] = (int)(in.direction.x*100);
                angles[1] = (int)(in.direction.y*100);
                angles[2] = (int)(in.direction.z*100);

                angles[0] %= 360;
                angles[1] %= 360;
                angles[2] %= 360;

                if ( (angles[0]*angles[1]) != 0 && (angles[1]*angles[2]) != 0 )
                {
                    FindSuitableMultiple(angles[0]);
                    FindSuitableMultiple(angles[1]);
                    FindSuitableMultiple(angles[2]);
                }

                int lcm = 360;

                if (angles[0])
                    lcm  = Math::lcm(lcm,angles[0]);

                if (angles[1])
                    lcm  = Math::lcm(lcm,angles[1]);

                if (angles[2])
                    lcm  = Math::lcm(lcm,angles[2]);

                if (360 == lcm)
                    break;

#if 0
                // This can be a division through zero, but we don't care
                float f1 = (float)lcm / angles[0];
                float f2 = (float)lcm / angles[1];
                float f3 = (float)lcm / angles[2];
#endif

                // find out how many time units we'll need for the finest
                // track (in seconds) - this defines the number of output
                // keys (fps * seconds)
                float max  = 0.f;
                if (angles[0])
                    max = (float)lcm / angles[0];
                if (angles[1])
                    max = std::max(max, (float)lcm / angles[1]);
                if (angles[2])
                    max = std::max(max, (float)lcm / angles[2]);

                anim->mNumRotationKeys = (unsigned int)(max*fps);
                anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys];

                // begin with a zero angle
                aiVector3D angle;
                for (unsigned int i = 0; i < anim->mNumRotationKeys;++i)
                {
                    // build the quaternion for the given euler angles
                    aiQuatKey& q = anim->mRotationKeys[i];

                    q.mValue = aiQuaternion(angle.x, angle.y, angle.z);
                    q.mTime = (double)i;

                    // increase the angle
                    angle += in.direction;
                }

                // This animation is repeated and repeated ...
                anim->mPostState = anim->mPreState = aiAnimBehaviour_REPEAT;
            }
            break;

        case Animator::FLY_CIRCLE:
            {
                // -----------------------------------------------------
                // Find out how much time we'll need to perform a
                // full circle.
                // -----------------------------------------------------
                const double seconds = (1. / in.speed) / 1000.;
                const double tdelta = 1000. / fps;

                anim->mNumPositionKeys = (unsigned int) (fps * seconds);
                anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                // from Irrlicht, what else should we do than copying it?
                aiVector3D vecU,vecV;
                if (in.direction.y) {
                    vecV = aiVector3D(50,0,0) ^ in.direction;
                }
                else vecV = aiVector3D(0,50,00) ^ in.direction;
                vecV.Normalize();
                vecU = (vecV ^ in.direction).Normalize();

                // build the output keys
                for (unsigned int i = 0; i < anim->mNumPositionKeys;++i)    {
                    aiVectorKey& key = anim->mPositionKeys[i];
                    key.mTime = i * tdelta;

                    const ai_real t = (ai_real) ( in.speed * key.mTime );
                    key.mValue = in.circleCenter  + in.circleRadius * ((vecU * std::cos(t)) + (vecV * std::sin(t)));
                }

                // This animation is repeated and repeated ...
                anim->mPostState = anim->mPreState = aiAnimBehaviour_REPEAT;
            }
            break;

        case Animator::FLY_STRAIGHT:
            {
                anim->mPostState = anim->mPreState = (in.loop ? aiAnimBehaviour_REPEAT : aiAnimBehaviour_CONSTANT);
                const double seconds = in.timeForWay / 1000.;
                const double tdelta = 1000. / fps;

                anim->mNumPositionKeys = (unsigned int) (fps * seconds);
                anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                aiVector3D diff = in.direction - in.circleCenter;
                const ai_real lengthOfWay = diff.Length();
                diff.Normalize();

                const double timeFactor = lengthOfWay / in.timeForWay;

                // build the output keys
                for (unsigned int i = 0; i < anim->mNumPositionKeys;++i)    {
                    aiVectorKey& key = anim->mPositionKeys[i];
                    key.mTime = i * tdelta;
                    key.mValue = in.circleCenter + diff * ai_real(timeFactor * key.mTime);
                }
            }
            break;

        case Animator::FOLLOW_SPLINE:
            {
                // repeat outside the defined time range
                anim->mPostState = anim->mPreState = aiAnimBehaviour_REPEAT;
                const int size = (int)in.splineKeys.size();
                if (!size)  {
                    // We have no point in the spline. That's bad. Really bad.
                    ASSIMP_LOG_WARN("IRR: Spline animators with no points defined");

                    delete anim;
                    anim = nullptr;
                    break;
                }
                else if (size == 1) {
                    // We have just one point in the spline so we don't need the full calculation
                    anim->mNumPositionKeys = 1;
                    anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                    anim->mPositionKeys[0].mValue = in.splineKeys[0].mValue;
                    anim->mPositionKeys[0].mTime  = 0.f;
                    break;
                }

                unsigned int ticksPerFull = 15;
                anim->mNumPositionKeys = (unsigned int) ( ticksPerFull * fps );
                anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                for (unsigned int i = 0; i < anim->mNumPositionKeys;++i)
                {
                    aiVectorKey& key = anim->mPositionKeys[i];

                    const ai_real dt = (i * in.speed * ai_real( 0.001 ) );
                    const ai_real u = dt - std::floor(dt);
                    const int idx = (int)std::floor(dt) % size;

                    // get the 4 current points to evaluate the spline
                    const aiVector3D& p0 = in.splineKeys[ ClampSpline( idx - 1, size ) ].mValue;
                    const aiVector3D& p1 = in.splineKeys[ ClampSpline( idx + 0, size ) ].mValue;
                    const aiVector3D& p2 = in.splineKeys[ ClampSpline( idx + 1, size ) ].mValue;
                    const aiVector3D& p3 = in.splineKeys[ ClampSpline( idx + 2, size ) ].mValue;

                    // compute polynomials
                    const ai_real u2 = u*u;
                    const ai_real u3 = u2*2;

                    const ai_real h1 = ai_real( 2.0 ) * u3 - ai_real( 3.0 ) * u2 + ai_real( 1.0 );
                    const ai_real h2 = ai_real( -2.0 ) * u3 + ai_real( 3.0 ) * u3;
                    const ai_real h3 = u3 - ai_real( 2.0 ) * u3;
                    const ai_real h4 = u3 - u2;

                    // compute the spline tangents
                    const aiVector3D t1 = ( p2 - p0 ) * in.tightness;
                    aiVector3D t2 = ( p3 - p1 ) * in.tightness;

                    // and use them to get the interpolated point
                    t2 = (h1 * p1 + p2 * h2 + t1 * h3 + h4 * t2);

                    // build a simple translation matrix from it
                    key.mValue = t2;
                    key.mTime  = (double) i;
                }
            }
            break;
        default:
            // UNKNOWN , OTHER
            break;
        };
        if (anim)   {
            anims.push_back(anim);
            ++total;
        }
    }
}